

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O2

string * __thiscall
duckdb::LogicalGet::GetColumnName_abi_cxx11_(LogicalGet *this,ColumnIndex *index)

{
  const_reference pvVar1;
  const_iterator cVar2;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)index->index;
  if (local_38._M_dataplus._M_p < (pointer)0x8000000000000000) {
    pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&this->names,(size_type)local_38._M_dataplus._M_p);
    return pvVar1;
  }
  cVar2 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->virtual_columns)._M_h,(key_type *)&local_38);
  if (cVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>.
      _M_cur != (__node_type *)0x0) {
    return (string *)
           ((long)cVar2.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                  ._M_cur + 0x10);
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Failed to find referenced virtual column %d",&local_39);
  InternalException::InternalException<unsigned_long>(this_00,&local_38,index->index);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const string &LogicalGet::GetColumnName(const ColumnIndex &index) const {
	if (index.IsVirtualColumn()) {
		auto entry = virtual_columns.find(index.GetPrimaryIndex());
		if (entry == virtual_columns.end()) {
			throw InternalException("Failed to find referenced virtual column %d", index.GetPrimaryIndex());
		}
		return entry->second.name;
	}
	return names[index.GetPrimaryIndex()];
}